

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenUnionCreator
          (PythonGenerator *this,EnumDef *enum_def,string *code_ptr)

{
  BaseType BVar1;
  bool bVar2;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar3;
  reference ppEVar4;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  EnumVal *local_170;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_160;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_48 [8];
  string enum_fn;
  string *code;
  string *code_ptr_local;
  EnumDef *enum_def_local;
  PythonGenerator *this_local;
  
  if (((enum_def->super_Definition).generated & 1U) == 0) {
    enum_fn.field_2._8_8_ = code_ptr;
    IdlNamer::Function_abi_cxx11_((string *)local_48,&this->namer_,&enum_def->super_Definition);
    std::__cxx11::string::operator+=((string *)enum_fn.field_2._8_8_,"\n");
    std::operator+(&local_98,"def ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::operator+(&local_78,&local_98,"Creator(unionType, table):");
    std::__cxx11::string::operator+=((string *)enum_fn.field_2._8_8_,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    GenIndents_abi_cxx11_(&local_d8,this,1);
    std::operator+(&local_b8,&local_d8,"from flatbuffers.table import Table");
    std::__cxx11::string::operator+=((string *)enum_fn.field_2._8_8_,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    GenIndents_abi_cxx11_(&local_118,this,1);
    std::operator+(&local_f8,&local_118,"if not isinstance(table, Table):");
    std::__cxx11::string::operator+=((string *)enum_fn.field_2._8_8_,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    GenIndents_abi_cxx11_((string *)&it,this,2);
    std::operator+(&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                   "return None");
    std::__cxx11::string::operator+=((string *)enum_fn.field_2._8_8_,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&it);
    pvVar3 = EnumDef::Vals(enum_def);
    local_160._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar3)
    ;
    while( true ) {
      pvVar3 = EnumDef::Vals(enum_def);
      ev = (EnumVal *)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar3)
      ;
      bVar2 = __gnu_cxx::operator!=
                        (&local_160,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev);
      if (!bVar2) break;
      ppEVar4 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_160);
      local_170 = *ppEVar4;
      BVar1 = (local_170->union_type).base_type;
      if (BVar1 == BASE_TYPE_STRING) {
        GenUnionCreatorForString(this,enum_def,local_170,(string *)enum_fn.field_2._8_8_);
      }
      else if (BVar1 == BASE_TYPE_STRUCT) {
        GenUnionCreatorForStruct(this,enum_def,local_170,(string *)enum_fn.field_2._8_8_);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_160);
    }
    GenIndents_abi_cxx11_(&local_1b0,this,1);
    std::operator+(&local_190,&local_1b0,"return None");
    std::__cxx11::string::operator+=((string *)enum_fn.field_2._8_8_,(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::operator+=((string *)enum_fn.field_2._8_8_,"\n");
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void GenUnionCreator(const EnumDef &enum_def, std::string *code_ptr) const {
    if (enum_def.generated) return;

    auto &code = *code_ptr;
    const auto enum_fn = namer_.Function(enum_def);

    code += "\n";
    code += "def " + enum_fn + "Creator(unionType, table):";
    code += GenIndents(1) + "from flatbuffers.table import Table";
    code += GenIndents(1) + "if not isinstance(table, Table):";
    code += GenIndents(2) + "return None";

    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      // Union only supports string and table.
      switch (ev.union_type.base_type) {
        case BASE_TYPE_STRUCT:
          GenUnionCreatorForStruct(enum_def, ev, &code);
          break;
        case BASE_TYPE_STRING:
          GenUnionCreatorForString(enum_def, ev, &code);
          break;
        default: break;
      }
    }
    code += GenIndents(1) + "return None";
    code += "\n";
  }